

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

png_const_charp png_convert_to_rfc1123(png_structrp png_ptr,png_const_timep ptime)

{
  int iVar1;
  
  if (png_ptr != (png_structrp)0x0) {
    iVar1 = png_convert_to_rfc1123_buffer(png_ptr->time_buffer,ptime);
    if (iVar1 != 0) {
      return png_ptr->time_buffer;
    }
    png_warning(png_ptr,"Ignoring invalid time value");
  }
  return (png_const_charp)0x0;
}

Assistant:

png_const_charp PNGAPI
png_convert_to_rfc1123(png_structrp png_ptr, png_const_timep ptime)
{
   if (png_ptr != NULL)
   {
      /* The only failure above if png_ptr != NULL is from an invalid ptime */
      if (png_convert_to_rfc1123_buffer(png_ptr->time_buffer, ptime) == 0)
         png_warning(png_ptr, "Ignoring invalid time value");

      else
         return png_ptr->time_buffer;
   }

   return NULL;
}